

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::SpectrumMixTexture::Evaluate
          (SpectrumMixTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  TextureEvalContext ctx_00;
  undefined1 auVar1 [12];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  SampledWavelengths lambda_00;
  SampledWavelengths lambda_01;
  array<float,_4> aVar5;
  undefined8 in_RDI;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar11 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  ulong in_XMM1_Qa;
  undefined1 auVar17 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  SampledSpectrum SVar18;
  undefined1 in_stack_00000008 [64];
  undefined8 in_stack_00000048;
  undefined8 in_stack_00000050;
  undefined8 in_stack_00000058;
  undefined8 in_stack_00000060;
  Float amt;
  SampledSpectrum t2;
  SampledSpectrum t1;
  SampledSpectrum *s;
  undefined4 uVar19;
  Float a;
  SampledSpectrum *this_00;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 *puVar23;
  undefined1 (*pauVar24) [64];
  undefined8 in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  undefined1 auVar2 [40];
  
  puVar23 = &stack0x00000048;
  pauVar24 = &&stack0x00000008;
  auVar6 = vmovdqu64_avx512f(in_stack_00000008);
  auVar6 = vmovdqu64_avx512f(auVar6);
  auVar7 = vmovdqu64_avx512f(auVar6);
  auVar6 = vmovdqu64_avx512f(auVar7);
  auVar11 = ZEXT856(auVar7._8_8_);
  auVar17 = ZEXT856(in_XMM1_Qa);
  ctx_01._8_8_ = in_stack_00000048;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)auVar6._56_8_;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)auVar6._56_8_ >> 0x20);
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_00000050;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_00000058;
  ctx_01._32_8_ = in_stack_00000060;
  ctx_01._40_8_ = in_stack_fffffffffffffe78;
  ctx_01._48_8_ = puVar23;
  ctx_01._56_8_ = in_RDI;
  lambda_00.lambda.values._8_8_ = in_stack_fffffffffffffe98;
  lambda_00.lambda.values._0_8_ = pauVar24;
  lambda_00.pdf.values._0_8_ = in_stack_fffffffffffffea0;
  lambda_00.pdf.values._8_8_ = in_stack_fffffffffffffea8;
  SVar18 = SpectrumTextureHandle::Evaluate(auVar6._24_8_,ctx_01,lambda_00);
  auVar12._0_8_ = SVar18.values.values._8_8_;
  auVar12._8_56_ = auVar17;
  auVar6._0_8_ = SVar18.values.values._0_8_;
  auVar6._8_56_ = auVar11;
  vmovlpd_avx(auVar6._0_16_);
  vmovlpd_avx(auVar12._0_16_);
  auVar6 = vmovdqu64_avx512f(*pauVar24);
  auVar6 = vmovdqu64_avx512f(auVar6);
  uVar20 = *puVar23;
  uVar21 = puVar23[1];
  uVar22 = puVar23[2];
  auVar7 = vmovdqu64_avx512f(auVar6);
  auVar6 = vmovdqu64_avx512f(auVar7);
  auVar11 = ZEXT856(auVar7._8_8_);
  auVar17 = ZEXT856(auVar17._0_8_);
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)uVar20;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)((ulong)uVar20 >> 0x20);
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)auVar6._56_8_;
  ctx_02.p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)auVar6._56_8_ >> 0x20);
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)uVar21;
  ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)uVar21 >> 0x20);
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar22;
  ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar22 >> 0x20);
  ctx_02._32_8_ = puVar23[3];
  ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)in_stack_fffffffffffffe78;
  ctx_02.dudx = (Float)(int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  ctx_02._48_8_ = puVar23;
  ctx_02.dvdy = (Float)(int)in_RDI;
  ctx_02.faceIndex = (int)((ulong)in_RDI >> 0x20);
  lambda_01.lambda.values[2] = (float)(int)in_stack_fffffffffffffe98;
  lambda_01.lambda.values[3] = (float)(int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  lambda_01.lambda.values._0_8_ = pauVar24;
  lambda_01.pdf.values[0] = (float)(int)in_stack_fffffffffffffea0;
  lambda_01.pdf.values[1] = (float)(int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  lambda_01.pdf.values[2] = (float)(int)in_stack_fffffffffffffea8;
  lambda_01.pdf.values[3] = (float)(int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  SVar18 = SpectrumTextureHandle::Evaluate(auVar6._24_8_,ctx_02,lambda_01);
  auVar13._0_8_ = SVar18.values.values._8_8_;
  auVar13._8_56_ = auVar17;
  auVar7._0_8_ = SVar18.values.values._0_8_;
  auVar7._8_56_ = auVar11;
  vmovlpd_avx(auVar7._0_16_);
  vmovlpd_avx(auVar13._0_16_);
  auVar6 = vmovdqu64_avx512f(*pauVar24);
  auVar6 = vmovdqu64_avx512f(auVar6);
  auVar6 = vmovdqu64_avx512f(auVar6);
  auVar6 = vmovdqu64_avx512f(auVar6);
  s = auVar6._0_8_;
  uVar19 = auVar6._8_4_;
  a = auVar6._12_4_;
  this_00 = auVar6._16_8_;
  auVar2 = auVar6._24_40_;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)uVar20;
  ctx_00.dudx = (Float)(int)((ulong)uVar20 >> 0x20);
  auVar1 = auVar2._0_12_;
  auVar3 = auVar2._12_12_;
  auVar4 = auVar2._24_12_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar1._0_4_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar1._4_4_;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar1._8_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar3._0_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar3._4_4_;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar3._8_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar4._0_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar4._4_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar4._8_4_;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)auVar2._36_4_;
  ctx_00.dudy = (Float)(int)uVar21;
  ctx_00.dvdx = (Float)(int)((ulong)uVar21 >> 0x20);
  ctx_00.dvdy = (Float)(int)uVar22;
  ctx_00.faceIndex = (int)((ulong)uVar22 >> 0x20);
  FloatTextureHandle::Evaluate(auVar6._8_8_,ctx_00);
  auVar17 = (undefined1  [56])0x0;
  auVar11 = (undefined1  [56])0x0;
  SVar18 = pbrt::operator*(a,s);
  auVar14._0_8_ = SVar18.values.values._8_8_;
  auVar14._8_56_ = auVar17;
  auVar8._0_8_ = SVar18.values.values._0_8_;
  auVar8._8_56_ = auVar11;
  vmovlpd_avx(auVar8._0_16_);
  vmovlpd_avx(auVar14._0_16_);
  auVar11 = (undefined1  [56])0x0;
  SVar18 = pbrt::operator*(a,s);
  auVar15._0_8_ = SVar18.values.values._8_8_;
  auVar15._8_56_ = auVar17;
  auVar9._0_8_ = SVar18.values.values._0_8_;
  auVar9._8_56_ = auVar11;
  vmovlpd_avx(auVar9._0_16_);
  vmovlpd_avx(auVar15._0_16_);
  SVar18 = SampledSpectrum::operator+(this_00,(SampledSpectrum *)CONCAT44(a,uVar19));
  auVar16._0_8_ = SVar18.values.values._8_8_;
  auVar16._8_56_ = auVar17;
  auVar10._0_8_ = SVar18.values.values._0_8_;
  auVar10._8_56_ = auVar11;
  uVar20 = vmovlpd_avx(auVar10._0_16_);
  uVar21 = vmovlpd_avx(auVar16._0_16_);
  aVar5.values[2] = (float)(int)uVar21;
  aVar5.values[3] = (float)(int)((ulong)uVar21 >> 0x20);
  aVar5.values[0] = (float)(int)uVar20;
  aVar5.values[1] = (float)(int)((ulong)uVar20 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar5.values;
}

Assistant:

Evaluate(TextureEvalContext ctx, SampledWavelengths lambda) const {
        SampledSpectrum t1 = tex1.Evaluate(ctx, lambda);
        SampledSpectrum t2 = tex2.Evaluate(ctx, lambda);
        Float amt = amount.Evaluate(ctx);
        return (1 - amt) * t1 + amt * t2;
    }